

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestRegularWithReordering::~BaseTestRegularWithReordering
          (BaseTestRegularWithReordering *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BaseTestRegularWithReordering() : b(m){}